

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O2

GetWitnessStackNumResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetWitnessStackNumRequestStruct,cfd::js::api::GetWitnessStackNumResponseStruct>
          (GetWitnessStackNumResponseStruct *__return_storage_ptr__,api *this,
          GetWitnessStackNumRequestStruct *request,
          function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
          *call_function,string *fuction_name)

{
  GetWitnessStackNumResponseStruct local_d8;
  
  GetWitnessStackNumResponseStruct::GetWitnessStackNumResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  ::operator()(&local_d8,
               (function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
                *)request,(GetWitnessStackNumRequestStruct *)this);
  GetWitnessStackNumResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}